

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::BitfieldInsertCase::compare
          (BitfieldInsertCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  long lVar3;
  uint uVar4;
  ostream *stream;
  byte bVar5;
  ostringstream *this_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  Hex<8UL> local_38;
  
  pSVar2 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar11 = true;
  if (0 < (int)uVar4) {
    uVar7 = (2 << ((&DAT_0096b0b0)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1;
    uVar8 = ~(-1 << ((byte)*inputs[3] & 0x1f));
    if (*inputs[3] == 0x20) {
      uVar8 = 0xffffffff;
    }
    bVar5 = (byte)*inputs[2];
    uVar9 = ~(uVar8 << (bVar5 & 0x1f));
    uVar6 = (*inputs[1] & uVar8) << (bVar5 & 0x1f) | **inputs & uVar9;
    uVar10 = 0;
    bVar11 = false;
    if (((**outputs ^ uVar6) & uVar7) == 0) {
      uVar10 = 0;
      do {
        if ((ulong)uVar4 - 1 == uVar10) {
          return true;
        }
        uVar6 = (*(uint *)((long)inputs[1] + (uVar10 + 1) * 4) & uVar8) << (bVar5 & 0x1f) |
                *(uint *)((long)*inputs + (uVar10 + 1) * 4) & uVar9;
        lVar3 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while (((*(uint *)((long)*outputs + lVar3 * 4) ^ uVar6) & uVar7) == 0);
      bVar11 = uVar4 <= uVar10;
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    stream = (ostream *)std::ostream::operator<<(this_00,(int)uVar10);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
    local_38.value = (deUint64)uVar6;
    tcu::Format::Hex<8UL>::toStream(&local_38,stream);
  }
  return bVar11;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			cmpMask			= getLowBitMask(integerLength);
		const int				offset			= *((const int*)inputs[2]);
		const int				bits			= *((const int*)inputs[3]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	base	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	insert	= ((const deUint32*)inputs[1])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];

			const deUint32	mask	= bits == 32 ? ~0u : (1u<<bits)-1;
			const deUint32	ref		= (base & ~(mask<<offset)) | ((insert & mask)<<offset);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}